

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_par_addsub_ge(DisasContext_conflict1 *s,arg_rrr *a,
                      _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_ptr_conflict *gen)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 var;
  TCGv_i32 arg;
  TCGv_ptr r;
  TCGv_ptr ge;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict1 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_ptr_conflict *gen_local;
  arg_rrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,3);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 != 0) {
    var = load_reg(s,a->rn);
    arg = load_reg(s,a->rm);
    r = tcg_temp_new_ptr(tcg_ctx_00);
    tcg_gen_addi_ptr(tcg_ctx_00,r,tcg_ctx_00->cpu_env,0x21c);
    (*gen)(tcg_ctx_00,var,var,arg,r);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_i32(tcg_ctx_00,arg);
    store_reg(s,a->rd,var);
  }
  return iVar1 != 0;
}

Assistant:

static bool op_par_addsub_ge(DisasContext *s, arg_rrr *a,
                             void (*gen)(TCGContext *, TCGv_i32, TCGv_i32,
                                         TCGv_i32, TCGv_ptr))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;
    TCGv_ptr ge;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);

    ge = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ge, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen(tcg_ctx, t0, t0, t1, ge);

    tcg_temp_free_ptr(tcg_ctx, ge);
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}